

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple9_rle.h
# Opt level: O2

uint32_t * __thiscall
FastPForLib::Simple9_RLE<true>::decodeArray
          (Simple9_RLE<true> *this,uint32_t *input,size_t param_2,uint32_t *out,size_t *nvalue)

{
  NotEnoughStorage *this_00;
  ulong req;
  
  req = (ulong)*input;
  if (req <= *nvalue) {
    Simple9_Codec::Decompress(input + 1,0,out,0,*input);
    *nvalue = req;
    return input + req + 1;
  }
  this_00 = (NotEnoughStorage *)__cxa_allocate_exception(0x18);
  NotEnoughStorage::NotEnoughStorage(this_00,req);
  __cxa_throw(this_00,&NotEnoughStorage::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const uint32_t *decodeArray(const uint32_t *input, const size_t,
                              uint32_t *out, size_t &nvalue) {
    uint32_t markednvalue;
    if (MarkLength) {
      markednvalue = *input++;
      if (markednvalue > nvalue)
        throw NotEnoughStorage(markednvalue);
    }
    const size_t actualvalue = MarkLength ? markednvalue : nvalue;
    if (nvalue < actualvalue) {
      fprintf(stderr, "possible overrun\n");
    }
    auto count = actualvalue;
    Simple9_Codec::Decompress(input, 0, out, 0, uint32_t(count));
    nvalue = MarkLength ? actualvalue : count;
    input += count;
    return input;
  }